

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O2

void __thiscall
Nova::Example<float,_3>::Write_Substep(Example<float,_3> *this,string *title,int substep,int level)

{
  string *psVar1;
  ostream *poVar2;
  
  if (this->write_substeps_level < level) {
    return;
  }
  psVar1 = &this->frame_title;
  std::__cxx11::string::_M_assign((string *)psVar1);
  poVar2 = std::operator<<(this->output,"Writing substep [");
  poVar2 = std::operator<<(poVar2,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,"]: output_number=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->output_number + 1);
  poVar2 = std::operator<<(poVar2,", frame=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->current_frame);
  poVar2 = std::operator<<(poVar2,", substep=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,substep);
  std::endl<char,std::char_traits<char>>(poVar2);
  this->output_number = this->output_number + 1;
  (*this->_vptr_Example[3])(this);
  std::__cxx11::string::assign((char *)psVar1);
  return;
}

Assistant:

void Example<T,d>::
Write_Substep(const std::string& title,const int substep,const int level)
{
    if(level<=write_substeps_level)
    {
        frame_title=title;
        *output<<"Writing substep ["<<frame_title<<"]: output_number="<<output_number+1<<", frame="<<current_frame<<", substep="<<substep<<std::endl;
        Write_Output_Files(++output_number);frame_title="";
    }
}